

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder.c
# Opt level: O1

lzma_ret lz_encoder_update(void *coder_ptr,lzma_allocator *allocator,lzma_filter *filters_null,
                          lzma_filter *reversed_filters)

{
  lzma_ret lVar1;
  
  if (*(code **)((long)coder_ptr + 0x18) == (code *)0x0) {
    lVar1 = LZMA_PROG_ERROR;
  }
  else {
    lVar1 = (**(code **)((long)coder_ptr + 0x18))(*coder_ptr,reversed_filters);
    if (lVar1 == LZMA_OK) {
      lVar1 = lzma_next_filter_update
                        ((lzma_next_coder *)((long)coder_ptr + 0x98),allocator,reversed_filters + 1)
      ;
      return lVar1;
    }
  }
  return lVar1;
}

Assistant:

static lzma_ret
lz_encoder_update(void *coder_ptr, const lzma_allocator *allocator,
		const lzma_filter *filters_null lzma_attribute((__unused__)),
		const lzma_filter *reversed_filters)
{
	lzma_coder *coder = coder_ptr;

	if (coder->lz.options_update == NULL)
		return LZMA_PROG_ERROR;

	return_if_error(coder->lz.options_update(
			coder->lz.coder, reversed_filters));

	return lzma_next_filter_update(
			&coder->next, allocator, reversed_filters + 1);
}